

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
reset<std::__cxx11::istringstream&>
          (basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
          basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *source,
          error_code *ec)

{
  uint uVar1;
  undefined8 in_RDX;
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *in_RDI;
  basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000178;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_00000180;
  
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  reset<std::__cxx11::istringstream&>(in_stack_00000180,in_stack_00000178);
  basic_staj_visitor<char>::reset((basic_staj_visitor<char> *)this);
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::reset(in_RDI);
  in_RDI[4].null_constant._M_dataplus = (_Alloc_hider)0x0;
  uVar1 = (*(in_RDI->super_basic_item_event_visitor<char>)._vptr_basic_item_event_visitor[3])();
  if ((uVar1 & 1) == 0) {
    (*(in_RDI->super_basic_item_event_visitor<char>)._vptr_basic_item_event_visitor[8])
              (in_RDI,in_RDX);
  }
  return;
}

Assistant:

void reset(Sourceable&& source, std::error_code& ec)
    {
        parser_.reset(std::forward<Sourceable>(source));
        cursor_visitor_.reset();
        cursor_handler_adaptor_.reset();
        eof_ = false;
        if (!done())
        {
            next(ec);
        }
    }